

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O2

void repackIfAllDigits(char *input,int aonly)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  char *pcVar4;
  char *pcVar5;
  short sVar6;
  char *s;
  
  pcVar5 = input + -2;
  pcVar4 = (char *)0x0;
  do {
    cVar2 = pcVar5[2];
    bVar1 = 1;
    if ((cVar2 == '\0') || (cVar2 == '-')) goto LAB_001cd64d;
    if ((byte)(cVar2 - 0x3aU) < 0xf6) {
      bVar1 = 0;
      if ((cVar2 != '.') || (pcVar4 != (char *)0x0)) {
LAB_001cd64d:
        if ((bool)(pcVar4 < pcVar5 & pcVar4 != (char *)0x0 & bVar1)) {
          if (aonly == 0) {
            sVar3 = *pcVar5 * 10 + (short)pcVar5[1] + -0x210;
            sVar6 = sVar3 % 0x22;
            cVar2 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(long)(sVar3 / 0x22) + 0x1f];
          }
          else {
            sVar3 = (short)pcVar5[1] + *pcVar5 * 10 + *input * 100 + -0x14d0;
            *input = 'A';
            sVar6 = sVar3 % 0x20;
            cVar2 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[sVar3 / 0x20];
          }
          *pcVar5 = cVar2;
          pcVar5[1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[sVar6];
        }
        return;
      }
      pcVar4 = pcVar5 + 2;
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static void repackIfAllDigits(char *input, const int aonly) {
    char *s = input;
    int alldigits = 1; // assume all digits
    char *e;
    char *dotpos = NULL;
    ASSERT(input);
    for (e = s; *e != 0 && *e != '-'; e++) {
        if (*e < '0' || *e > '9') {
            if (*e == '.' && !dotpos) {
                dotpos = e;
            } else {
                alldigits = 0;
                break;
            }
        }
    }
    e--;
    s = e - 1;
    if (alldigits && dotpos &&
        s > dotpos) // e is last char, s is one before, both are beyond dot, all characters are digits
    {
        if (aonly) // v1.50 - encode only using the letter A
        {
            const int v = ((*input) - '0') * 100 + ((*s) - '0') * 10 + ((*e) - '0');
            *input = 'A';
            *s = ENCODE_CHARS[v / 32];
            *e = ENCODE_CHARS[v % 32];
        } else // encode using A,E,U
        {
            const int v = ((*s) - '0') * 10 + ((*e) - '0');
            *s = ENCODE_CHARS[(v / 34) + 31];
            *e = ENCODE_CHARS[v % 34];
        }
    }
}